

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::condense_leaf(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *this,size_t N)

{
  pointer prVar1;
  ulong uVar2;
  pointer prVar3;
  pointer bg;
  pointer bg_1;
  long lVar4;
  ulong *puVar5;
  iterator found;
  temporal_vec_type eliminated_objs;
  undefined1 local_78 [32];
  undefined1 local_58 [16];
  stored_size_type local_48;
  ulong local_40 [2];
  long local_30;
  
  local_78._16_8_ = N;
  if ((this->tree_).m_holder.m_size <= N) {
    boost::container::throw_out_of_range("vector::at out of range");
  }
  prVar1 = (this->tree_).m_holder.m_start;
  if (prVar1[N].is_leaf == false) {
    __assert_fail("node.is_leaf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                  ,0x151,
                  "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                 );
  }
  uVar2 = prVar1[N].entry.
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  if ((1 < uVar2) || (prVar1[N].parent == 0xffffffffffffffff)) {
    return;
  }
  local_78._0_8_ = &prVar1[N].entry;
  local_58._8_8_ = 0;
  local_48 = 2;
  local_78._24_8_ =
       (long)&(((container_type *)local_78._0_8_)->
              super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
              ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage +
       uVar2 * 8;
  local_58._0_8_ = local_40;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<boost::container::vec_iterator<unsigned_long*,true>,std::back_insert_iterator<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>>
            ((vec_iterator<unsigned_long_*,_true> *)local_78,
             (vec_iterator<unsigned_long_*,_true> *)(local_78 + 0x18),
             (small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)local_58);
  uVar2 = prVar1[N].parent;
  if (uVar2 < (this->tree_).m_holder.m_size) {
    prVar3 = (this->tree_).m_holder.m_start;
    local_78._0_8_ = &prVar3[uVar2].entry;
    local_78._24_8_ =
         prVar3[uVar2].box.center.values_.elems +
         prVar3[uVar2].entry.
         super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         .m_holder.m_size + 0xfffffffffffffff9;
    std::
    __find_if<boost::container::vec_iterator<unsigned_long*,false>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
              (local_78 + 8,local_78,local_78 + 0x18,local_78 + 0x10);
    uVar2 = prVar1[N].parent;
    if ((this->tree_).m_holder.m_size <= uVar2) {
      boost::container::throw_out_of_range("vector::at out of range");
    }
    prVar3 = (this->tree_).m_holder.m_start;
    if ((double *)local_78._8_8_ ==
        prVar3[uVar2].box.center.values_.elems +
        prVar3[uVar2].entry.
        super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
        .m_holder.m_size + 0xfffffffffffffff9) {
      __assert_fail("found != this->tree_.at(node.parent).entry.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x162,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_leaf(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    local_30 = local_78._8_8_;
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::erase((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)local_78,(const_iterator *)&prVar3[uVar2].entry);
    if (prVar1[N].parent < (this->tree_).m_holder.m_size) {
      condense_box(this,(this->tree_).m_holder.m_start + prVar1[N].parent);
      if (local_58._8_8_ != 0) {
        lVar4 = local_58._8_8_ << 3;
        puVar5 = (ulong *)local_58._0_8_;
        do {
          if (puVar5 == (ulong *)0x0) {
            __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                          "reference boost::container::vec_iterator<unsigned long *, true>::operator*() const [Pointer = unsigned long *, IsConst = true]"
                         );
          }
          if ((this->container_).m_holder.m_size <= *puVar5) {
            boost::container::throw_out_of_range("vector::at out of range");
          }
          insert(this,(this->container_).m_holder.m_start + *puVar5);
          puVar5 = puVar5 + 1;
          lVar4 = lVar4 + -8;
        } while (lVar4 != 0);
      }
      condense_node(this,prVar1[N].parent);
      if (local_48 == 0) {
        return;
      }
      if (local_40 == (ulong *)local_58._0_8_) {
        return;
      }
      operator_delete((void *)local_58._0_8_);
      return;
    }
  }
  boost::container::throw_out_of_range("vector::at out of range");
}

Assistant:

void condense_leaf(const std::size_t N)
    {
        const node_type& node = this->tree_.at(N);
        assert(node.is_leaf);

        if(node.has_enough_entry() || node.parent == nil)
        {
            return;
        }

        // copy index of objects
        typedef typename gen_small_vector<std::size_t, min_entry>::type temporal_vec_type;
        temporal_vec_type eliminated_objs;
        std::copy(node.entry.begin(), node.entry.end(),
                  std::back_inserter(eliminated_objs));

        // erase the node N from its parent and condense aabb
        typename node_type::iterator found = std::find(
                this->tree_.at(node.parent).entry.begin(),
                this->tree_.at(node.parent).entry.end(), N);
        assert(found != this->tree_.at(node.parent).entry.end());
        this->tree_.at(node.parent).entry.erase(found);
        this->condense_box(this->tree_.at(node.parent));

        // re-insert entries eliminated from node N
        for(typename temporal_vec_type::const_iterator
                i(eliminated_objs.begin()), e(eliminated_objs.end()); i!=e; ++i)
        {
            this->insert(this->container_.at(*i));
        }

        // condense ancester nodes...
        condense_node(node.parent);
        return;
    }